

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<kj::Promise<bool>_> * __thiscall
kj::_::ExceptionOr<kj::Promise<bool>_>::operator=
          (ExceptionOr<kj::Promise<bool>_> *this,ExceptionOr<kj::Promise<bool>_> *param_1)

{
  ExceptionOr<kj::Promise<bool>_> *param_1_local;
  ExceptionOr<kj::Promise<bool>_> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<kj::Promise<bool>_>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;